

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

void __thiscall
front::irGenerator::irGenerator::insertFunc
          (irGenerator *this,string *key,shared_ptr<mir::inst::MirFunction> *func)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  pointer pcVar3;
  shared_ptr<mir::types::FunctionTy> local_1a0;
  string local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>
  local_170;
  MirFunction local_b8;
  
  peVar2 = (func->super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pcVar3 = (peVar2->name)._M_dataplus._M_p;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar3,pcVar3 + (peVar2->name)._M_string_length);
  peVar2 = (func->super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1a0.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar2->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1a0.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (peVar2->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  if (local_1a0.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1a0.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1a0.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1a0.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1a0.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  mir::inst::MirFunction::MirFunction(&local_b8,&local_190,&local_1a0);
  paVar1 = &local_170.first.field_2;
  pcVar3 = (key->_M_dataplus)._M_p;
  local_170.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar3,pcVar3 + key->_M_string_length);
  mir::inst::MirFunction::MirFunction(&local_170.second,&local_b8);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,mir::inst::MirFunction>,std::_Select1st<std::pair<std::__cxx11::string_const,mir::inst::MirFunction>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mir::inst::MirFunction>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,mir::inst::MirFunction>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,mir::inst::MirFunction>,std::_Select1st<std::pair<std::__cxx11::string_const,mir::inst::MirFunction>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mir::inst::MirFunction>>>
              *)&(this->_package).functions,&local_170);
  local_170.second.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ed478;
  std::
  _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::~_Rb_tree(&local_170.second.basic_blks._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  ::~_Rb_tree(&local_170.second.variables._M_t);
  if (local_170.second.type.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.second.type.
               super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.second.name._M_dataplus._M_p != &local_170.second.name.field_2) {
    operator_delete(local_170.second.name._M_dataplus._M_p,
                    local_170.second.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_170.first._M_dataplus._M_p,
                    local_170.first.field_2._M_allocated_capacity + 1);
  }
  local_b8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ed478;
  std::
  _Rb_tree<int,_std::pair<const_int,_mir::inst::BasicBlk>,_std::_Select1st<std::pair<const_int,_mir::inst::BasicBlk>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::~_Rb_tree(&local_b8.basic_blks._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  ::~_Rb_tree(&local_b8.variables._M_t);
  if (local_b8.type.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.type.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.name._M_dataplus._M_p != &local_b8.name.field_2) {
    operator_delete(local_b8.name._M_dataplus._M_p,local_b8.name.field_2._M_allocated_capacity + 1);
  }
  if (local_1a0.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void irGenerator::insertFunc(string key,
                             shared_ptr<mir::inst::MirFunction> func) {
  _package.functions.insert(
      {key, mir::inst::MirFunction(func->name, func->type)});
}